

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdrawhelper.cpp
# Opt level: O3

void fetchTransformedBilinear_slow_fetcher<(TextureBlendType)4,(QPixelLayout::BPP)6,unsigned_int>
               (uint *buf1,uint *buf2,ushort *distxs,ushort *distys,int len,QTextureData *image,
               qreal *fx,qreal *fy,qreal *fw,qreal fdx,qreal fdy,qreal fdw)

{
  uchar *puVar1;
  long lVar2;
  double __x;
  double dVar3;
  double dVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  ulong uVar12;
  double __x_00;
  double dVar13;
  
  if (0 < len) {
    puVar1 = image->imageData;
    lVar2 = image->bytesPerLine;
    dVar13 = *fw;
    uVar12 = 0;
    do {
      dVar3 = (double)(-(ulong)(dVar13 == 0.0) & 0x40d0000000000000 |
                      ~-(ulong)(dVar13 == 0.0) & (ulong)(1.0 / dVar13));
      dVar13 = *fx;
      __x = dVar3 * dVar13 + -0.5;
      __x_00 = *fy * dVar3 + -0.5;
      dVar3 = floor(__x);
      iVar11 = (int)dVar3;
      dVar4 = floor(__x_00);
      iVar6 = (int)dVar4;
      distxs[uVar12] = (ushort)(int)((__x - (double)(int)dVar3) * 65536.0);
      distys[uVar12] = (ushort)(int)((__x_00 - (double)(int)dVar4) * 65536.0);
      iVar8 = image->x2 + -1;
      iVar5 = iVar11;
      if (iVar8 < iVar11) {
        iVar5 = iVar8;
      }
      iVar9 = iVar11 + 1;
      if (iVar8 <= iVar11) {
        iVar9 = iVar8;
      }
      iVar8 = image->x1;
      if (iVar11 < iVar8) {
        iVar9 = iVar8;
        iVar5 = iVar8;
      }
      iVar11 = image->y2 + -1;
      iVar8 = iVar6;
      if (iVar11 < iVar6) {
        iVar8 = iVar11;
      }
      iVar10 = iVar6 + 1;
      if (iVar11 <= iVar6) {
        iVar10 = iVar11;
      }
      iVar11 = image->y1;
      if (iVar6 < iVar11) {
        iVar10 = iVar11;
        iVar8 = iVar11;
      }
      lVar7 = iVar8 * lVar2;
      buf1[uVar12 * 2] = *(uint *)(puVar1 + (long)iVar5 * 4 + lVar7);
      buf1[uVar12 * 2 + 1] = *(uint *)(puVar1 + (long)iVar9 * 4 + lVar7);
      lVar7 = iVar10 * lVar2;
      buf2[uVar12 * 2] = *(uint *)(puVar1 + (long)iVar5 * 4 + lVar7);
      buf2[uVar12 * 2 + 1] = *(uint *)(puVar1 + (long)iVar9 * 4 + lVar7);
      *fx = dVar13 + fdx;
      *fy = *fy + fdy;
      dVar13 = *fw + fdw;
      *fw = dVar13;
      uVar12 = uVar12 + 1;
    } while ((uint)len != uVar12);
  }
  return;
}

Assistant:

static void QT_FASTCALL fetchTransformedBilinear_slow_fetcher(T *buf1, T *buf2, ushort *distxs, ushort *distys,
                                                              const int len, const QTextureData &image,
                                                              qreal &fx, qreal &fy, qreal &fw,
                                                              const qreal fdx, const qreal fdy, const qreal fdw)
{
    const QPixelLayout &layout = qPixelLayouts[image.format];
    constexpr bool useFetch = (bpp < QPixelLayout::BPP32);
    if (useFetch)
        Q_ASSERT(sizeof(T) == sizeof(uint));
    else
        Q_ASSERT(layout.bpp == bpp);

    const Fetch1PixelFunc fetch1 = (bpp == QPixelLayout::BPPNone) ? fetch1PixelTable[layout.bpp] : fetch1Pixel<bpp>;

    for (int i = 0; i < len; ++i) {
        const qreal iw = fw == 0 ? 16384 : 1 / fw;
        const qreal px = fx * iw - qreal(0.5);
        const qreal py = fy * iw - qreal(0.5);

        int x1 = qFloor(px);
        int x2;
        int y1 = qFloor(py);
        int y2;

        distxs[i] = ushort((px - x1) * (1<<16));
        distys[i] = ushort((py - y1) * (1<<16));

        fetchTransformedBilinear_pixelBounds<blendType>(image.width, image.x1, image.x2 - 1, x1, x2);
        fetchTransformedBilinear_pixelBounds<blendType>(image.height, image.y1, image.y2 - 1, y1, y2);

        const uchar *s1 = image.scanLine(y1);
        const uchar *s2 = image.scanLine(y2);
        if constexpr (useFetch) {
            buf1[i * 2 + 0] = fetch1(s1, x1);
            buf1[i * 2 + 1] = fetch1(s1, x2);
            buf2[i * 2 + 0] = fetch1(s2, x1);
            buf2[i * 2 + 1] = fetch1(s2, x2);
        } else {
            buf1[i * 2 + 0] = reinterpret_cast<const T *>(s1)[x1];
            buf1[i * 2 + 1] = reinterpret_cast<const T *>(s1)[x2];
            buf2[i * 2 + 0] = reinterpret_cast<const T *>(s2)[x1];
            buf2[i * 2 + 1] = reinterpret_cast<const T *>(s2)[x2];
        }

        fx += fdx;
        fy += fdy;
        fw += fdw;
    }
}